

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

pair<QMultiHash<int,_QString>::iterator,_QMultiHash<int,_QString>::iterator> * __thiscall
QMultiHash<int,_QString>::equal_range_impl<int>(QMultiHash<int,_QString> *this,int *key)

{
  piter it;
  piter it_00;
  bool bVar1;
  pair<QMultiHash<int,_QString>::iterator,_QMultiHash<int,_QString>::iterator> *in_RDI;
  long in_FS_OFFSET;
  pair<QMultiHash<int,_QString>::const_iterator,_QMultiHash<int,_QString>::const_iterator> pair;
  QMultiHash<int,_QString> copy;
  QMultiHash<int,_QString> *in_stack_fffffffffffffef8;
  QMultiHash<int,_QString> *in_stack_ffffffffffffff00;
  iterator *this_00;
  Data<QHashPrivate::MultiNode<int,_QString>_> *__x;
  size_t in_stack_ffffffffffffff18;
  iterator *__y;
  iterator local_90;
  undefined1 *local_78;
  Span *pSStack_70;
  Data<QHashPrivate::MultiNode<int,_QString>_> local_60;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  QMultiHash<int,_QString> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_18.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  bVar1 = isDetached(in_stack_ffffffffffffff00);
  if (bVar1) {
    memset(&local_18,0,0x10);
    QMultiHash(&local_18);
  }
  else {
    QMultiHash(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  detach(in_stack_ffffffffffffff00);
  local_60.seed = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_60.spans = (Span *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  equal_range(in_stack_ffffffffffffff00,(int *)in_stack_fffffffffffffef8);
  local_78 = (undefined1 *)local_60.seed;
  pSStack_70 = local_60.spans;
  this_00 = (iterator *)0x0;
  __x = &local_60;
  it.bucket = in_stack_ffffffffffffff18;
  it.d = __x;
  iterator::iterator((iterator *)0x0,it,(Chain **)in_stack_ffffffffffffff00);
  __y = &local_90;
  it_00.bucket = (size_t)__y;
  it_00.d = __x;
  iterator::iterator(this_00,it_00,(Chain **)in_stack_ffffffffffffff00);
  std::pair<QMultiHash<int,_QString>::iterator,_QMultiHash<int,_QString>::iterator>::
  pair<QMultiHash<int,_QString>::iterator,_QMultiHash<int,_QString>::iterator,_true>
            (in_RDI,(iterator *)__x,__y);
  ~QMultiHash(in_stack_ffffffffffffff00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::pair<iterator, iterator> equal_range_impl(const K &key)
    {
        const auto copy = isDetached() ? QMultiHash() : *this; // keep 'key' alive across the detach
        detach();
        auto pair = std::as_const(*this).equal_range(key);
        return {iterator(pair.first.i), iterator(pair.second.i)};
    }